

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

char * __thiscall
MemoryLeakDetector::reallocateMemoryAndLeakInformation
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,size_t line,bool allocatNodesSeperately)

{
  uchar uVar1;
  MemLeakPeriod MVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  MemoryLeakDetectorNode *pMVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = size + 3 & 0xfffffffffffffff8;
  pcVar4 = (char *)(*PlatformSpecificRealloc)
                             (memory,uVar7 + (ulong)!allocatNodesSeperately * 0x40 + 8);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    if (allocatNodesSeperately) {
      iVar3 = (*allocator->_vptr_TestMemoryAllocator[8])(allocator,0x40);
      pMVar5 = (MemoryLeakDetectorNode *)CONCAT44(extraout_var,iVar3);
    }
    else {
      pMVar5 = (MemoryLeakDetectorNode *)(pcVar4 + uVar7 + 8);
    }
    uVar6 = this->allocationSequenceNumber_;
    this->allocationSequenceNumber_ = uVar6 + 1;
    MVar2 = this->current_period_;
    uVar1 = this->current_allocation_stage_;
    pMVar5->number_ = uVar6;
    pMVar5->memory_ = pcVar4;
    pMVar5->size_ = size;
    pMVar5->allocator_ = allocator;
    pMVar5->period_ = MVar2;
    pMVar5->allocation_stage_ = uVar1;
    pMVar5->file_ = file;
    pMVar5->line_ = line;
    pcVar4[size + 2] = 'S';
    (pcVar4 + size)[0] = 'B';
    (pcVar4 + size)[1] = 'A';
    pcVar4 = pMVar5->memory_;
    uVar6 = (int)pcVar4 + (int)((ulong)pcVar4 / 0x49) * -0x49;
    pMVar5->next_ = (this->memoryTable_).table_[uVar6].head_;
    (this->memoryTable_).table_[uVar6].head_ = pMVar5;
  }
  return pcVar4;
}

Assistant:

char* MemoryLeakDetector::reallocateMemoryAndLeakInformation(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
    char* new_memory = reallocateMemoryWithAccountingInformation(allocator, memory, size, file, line, allocatNodesSeperately);
    if (new_memory == NULLPTR) return NULLPTR;

    MemoryLeakDetectorNode *node = createMemoryLeakAccountingInformation(allocator, size, new_memory, allocatNodesSeperately);
    storeLeakInformation(node, new_memory, size, allocator, file, line);
    return node->memory_;
}